

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceListTestCase::queryResourceList
          (ResourceListTestCase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dst,GLuint program)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  char *pcVar5;
  int iVar6;
  GLint maxNameLength;
  GLint numActiveResources;
  GLint written;
  vector<char,_std::allocator<char>_> buffer;
  int local_1e8;
  GLuint local_1e4;
  int local_1e0;
  int local_1dc;
  _Vector_base<char,_std::allocator<char>_> local_1d8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1b8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [46];
  long lVar4;
  
  local_1e4 = program;
  local_1b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dst;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  iVar2 = *(int *)(Functional::(anonymous_namespace)::
                   getProgramInterfaceGLEnum(deqp::gles31::Functional::ProgramInterface)::s_enums +
                  (long)(int)this->m_programInterface * 4);
  local_1e0 = 0;
  local_1e8 = 0;
  local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Querying ");
  pcVar5 = glu::getProgramInterfaceName(iVar2);
  std::operator<<((ostream *)poVar1,pcVar5);
  std::operator<<((ostream *)poVar1," interface:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar4 + 0x990))(local_1e4,iVar2,0x92f5,&local_1e0);
  (**(code **)(lVar4 + 0x990))(local_1e4,iVar2,0x92f6,&local_1e8);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"query interface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x3f2);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"\tGL_ACTIVE_RESOURCES = ");
  std::ostream::operator<<(poVar1,local_1e0);
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"\tGL_MAX_NAME_LENGTH = ");
  std::ostream::operator<<(poVar1,local_1e8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Querying all active resources");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)&local_1d8,(long)(local_1e8 + 1),local_1b0);
  for (iVar6 = 0; iVar6 < local_1e0; iVar6 = iVar6 + 1) {
    local_1dc = 0;
    (**(code **)(lVar4 + 0x9c0))
              (local_1e4,iVar2,iVar6,local_1e8,&local_1dc,
               local_1d8._M_impl.super__Vector_impl_data._M_start);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"query resource name",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x402);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,local_1d8._M_impl.super__Vector_impl_data._M_start,
               local_1d8._M_impl.super__Vector_impl_data._M_start + local_1dc);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    std::__cxx11::string::~string((string *)local_1b0);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_1d8);
  return;
}

Assistant:

void ResourceListTestCase::queryResourceList (std::vector<std::string>& dst, glw::GLuint program)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glw::GLenum		programInterface	= getProgramInterfaceGLEnum(m_programInterface);
	glw::GLint				numActiveResources	= 0;
	glw::GLint				maxNameLength		= 0;
	std::vector<char>		buffer;

	m_testCtx.getLog() << tcu::TestLog::Message << "Querying " << glu::getProgramInterfaceName(programInterface) << " interface:" << tcu::TestLog::EndMessage;

	gl.getProgramInterfaceiv(program, programInterface, GL_ACTIVE_RESOURCES, &numActiveResources);
	gl.getProgramInterfaceiv(program, programInterface, GL_MAX_NAME_LENGTH, &maxNameLength);
	GLU_EXPECT_NO_ERROR(gl.getError(), "query interface");

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "\tGL_ACTIVE_RESOURCES = " << numActiveResources << "\n"
						<< "\tGL_MAX_NAME_LENGTH = " << maxNameLength
						<< tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::Message << "Querying all active resources" << tcu::TestLog::EndMessage;

	buffer.resize(maxNameLength+1, '\0');

	for (int resourceNdx = 0; resourceNdx < numActiveResources; ++resourceNdx)
	{
		glw::GLint written = 0;

		gl.getProgramResourceName(program, programInterface, resourceNdx, maxNameLength, &written, &buffer[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource name");

		dst.push_back(std::string(&buffer[0], written));
	}
}